

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_0::VertexAttributeSizeCase::test
          (VertexAttributeSizeCase *this)

{
  TestLog *pTVar1;
  long lVar2;
  GLuint local_1b0 [2];
  GLuint vaos [2];
  GLuint buf;
  allocator<char> local_179;
  string local_178;
  ScopedLogSection local_158;
  ScopedLogSection section_1;
  int ndx;
  allocator<char> local_111;
  string local_110;
  ScopedLogSection local_f0;
  ScopedLogSection section;
  PointerData pointers [8];
  GLfloat vertexData [4];
  VertexAttributeSizeCase *this_local;
  
  pointers[7].pointer = (void *)0x0;
  section.m_log._0_4_ = 4;
  section.m_log._4_4_ = 0x1406;
  pointers[0].size = 0;
  pointers[0].type._0_1_ = '\0';
  pointers[0]._8_8_ = &pointers[7].pointer;
  pointers[0].pointer._0_4_ = 3;
  pointers[0].pointer._4_4_ = 0x1406;
  pointers[1].size = 0;
  pointers[1].type._0_1_ = '\0';
  pointers[1].pointer._0_4_ = 2;
  pointers[1].pointer._4_4_ = 0x1406;
  pointers[2].size = 0;
  pointers[2].type._0_1_ = 0;
  pointers[2].pointer._0_4_ = 1;
  pointers[2].pointer._4_4_ = 0x1406;
  pointers[3].size = 0;
  pointers[3].type._0_1_ = 0;
  pointers[3].pointer._0_4_ = 4;
  pointers[3].pointer._4_4_ = 0x1404;
  pointers[4].size = 0;
  pointers[4].type._0_1_ = 0;
  pointers[4].pointer._0_4_ = 3;
  pointers[4].pointer._4_4_ = 0x1404;
  pointers[5].size = 0;
  pointers[5].type._0_1_ = 0;
  pointers[5].pointer._0_4_ = 2;
  pointers[5].pointer._4_4_ = 0x1404;
  pointers[6].size = 0;
  pointers[6].type._0_1_ = 0;
  pointers[6].pointer._0_4_ = 1;
  pointers[6].pointer._4_4_ = 0x1404;
  pointers[7].size = 0;
  pointers[7].type._0_1_ = 0;
  pTVar1 = (this->super_ApiCase).m_log;
  pointers[1]._8_8_ = pointers[0]._8_8_;
  pointers[2]._8_8_ = pointers[0]._8_8_;
  pointers[3]._8_8_ = pointers[0]._8_8_;
  pointers[4]._8_8_ = pointers[0]._8_8_;
  pointers[5]._8_8_ = pointers[0]._8_8_;
  pointers[6]._8_8_ = pointers[0]._8_8_;
  pointers[7]._8_8_ = pointers[0]._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"DefaultVAO",&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ndx,"Test with default VAO",(allocator<char> *)((long)&section_1.m_log + 7))
  ;
  tcu::ScopedLogSection::ScopedLogSection(&local_f0,pTVar1,&local_110,(string *)&ndx);
  std::__cxx11::string::~string((string *)&ndx);
  std::allocator<char>::~allocator((allocator<char> *)((long)&section_1.m_log + 7));
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  for (section_1.m_log._0_4_ = 0; (int)section_1.m_log < 8;
      section_1.m_log._0_4_ = (int)section_1.m_log + 1) {
    lVar2 = (long)(int)section_1.m_log;
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_ApiCase).super_CallLogWrapper,0,*(GLint *)&pointers[lVar2 + -1].pointer
               ,*(GLenum *)((long)&pointers[lVar2 + -1].pointer + 4),(GLboolean)pointers[lVar2].type
               ,pointers[lVar2].size,*(void **)&pointers[lVar2].stride);
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       &(this->super_ApiCase).super_CallLogWrapper,0,0x8623,
                       *(GLenum *)&pointers[(long)(int)section_1.m_log + -1].pointer);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&local_f0);
  pTVar1 = (this->super_ApiCase).m_log;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"WithVAO",&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&buf,"Test with VAO",(allocator<char> *)((long)vaos + 7));
  tcu::ScopedLogSection::ScopedLogSection(&local_158,pTVar1,&local_178,(string *)&buf);
  std::__cxx11::string::~string((string *)&buf);
  std::allocator<char>::~allocator((allocator<char> *)((long)vaos + 7));
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  vaos[0] = 0;
  local_1b0[0] = 0;
  local_1b0[1] = 0;
  glu::CallLogWrapper::glGenVertexArrays(&(this->super_ApiCase).super_CallLogWrapper,2,local_1b0);
  glu::CallLogWrapper::glGenBuffers(&(this->super_ApiCase).super_CallLogWrapper,1,vaos);
  glu::CallLogWrapper::glBindBuffer(&(this->super_ApiCase).super_CallLogWrapper,0x8892,vaos[0]);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(&(this->super_ApiCase).super_CallLogWrapper,local_1b0[0]);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     &(this->super_ApiCase).super_CallLogWrapper,0,0x8623,4);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glVertexAttribPointer
            (&(this->super_ApiCase).super_CallLogWrapper,0,(GLenum)section.m_log,section.m_log._4_4_
             ,(GLboolean)pointers[0].type,pointers[0].size,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(&(this->super_ApiCase).super_CallLogWrapper,local_1b0[1]);
  glu::CallLogWrapper::glVertexAttribPointer
            (&(this->super_ApiCase).super_CallLogWrapper,0,(GLenum)pointers[0].pointer,
             pointers[0].pointer._4_4_,(GLboolean)pointers[1].type,pointers[1].size,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     &(this->super_ApiCase).super_CallLogWrapper,0,0x8623,
                     (GLenum)pointers[0].pointer);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(&(this->super_ApiCase).super_CallLogWrapper,local_1b0[0]);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     &(this->super_ApiCase).super_CallLogWrapper,0,0x8623,(GLenum)section.m_log);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glDeleteVertexArrays(&(this->super_ApiCase).super_CallLogWrapper,2,local_1b0)
  ;
  glu::CallLogWrapper::glDeleteBuffers(&(this->super_ApiCase).super_CallLogWrapper,1,vaos);
  ApiCase::expectError(&this->super_ApiCase,0);
  tcu::ScopedLogSection::~ScopedLogSection(&local_158);
  return;
}

Assistant:

void test (void)
	{
		GLfloat vertexData[4] = {0.0f}; // never accessed

		const PointerData pointers[] =
		{
			// size test
			{ 4, GL_FLOAT,		0,	GL_FALSE, vertexData },
			{ 3, GL_FLOAT,		0,	GL_FALSE, vertexData },
			{ 2, GL_FLOAT,		0,	GL_FALSE, vertexData },
			{ 1, GL_FLOAT,		0,	GL_FALSE, vertexData },
			{ 4, GL_INT,		0,	GL_FALSE, vertexData },
			{ 3, GL_INT,		0,	GL_FALSE, vertexData },
			{ 2, GL_INT,		0,	GL_FALSE, vertexData },
			{ 1, GL_INT,		0,	GL_FALSE, vertexData },
		};

		// Test with default VAO
		{
			const tcu::ScopedLogSection section(m_log, "DefaultVAO", "Test with default VAO");

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
			{
				glVertexAttribPointer(0, pointers[ndx].size, pointers[ndx].type, pointers[ndx].normalized, pointers[ndx].stride, pointers[ndx].pointer);
				expectError(GL_NO_ERROR);

				verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_SIZE, pointers[ndx].size);
			}
		}

		// Test with multiple VAOs
		{
			const tcu::ScopedLogSection section(m_log, "WithVAO", "Test with VAO");

			GLuint buf		= 0;
			GLuint vaos[2]	= {0};

			glGenVertexArrays(2, vaos);
			glGenBuffers(1, &buf);
			glBindBuffer(GL_ARRAY_BUFFER, buf);
			expectError(GL_NO_ERROR);

			// initial
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_SIZE, 4);
			expectError(GL_NO_ERROR);

			// set vao 0 to some value
			glVertexAttribPointer(0, pointers[0].size, pointers[0].type, pointers[0].normalized, pointers[0].stride, DE_NULL);
			expectError(GL_NO_ERROR);

			// set vao 1 to some other value
			glBindVertexArray(vaos[1]);
			glVertexAttribPointer(0, pointers[1].size, pointers[1].type, pointers[1].normalized, pointers[1].stride, DE_NULL);
			expectError(GL_NO_ERROR);

			// verify vao 1 state
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_SIZE, pointers[1].size);
			expectError(GL_NO_ERROR);

			// verify vao 0 state
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_SIZE, pointers[0].size);
			expectError(GL_NO_ERROR);

			glDeleteVertexArrays(2, vaos);
			glDeleteBuffers(1, &buf);
			expectError(GL_NO_ERROR);
		}
	}